

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

DistantLight *
pbrt::DistantLight::Create
          (Transform *renderFromLight,ParameterDictionary *parameters,RGBColorSpace *colorSpace,
          FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  DistantLight *pDVar3;
  undefined1 auVar4 [16];
  Float FVar5;
  Float FVar6;
  Float FVar7;
  undefined8 uVar9;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar10;
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  Point3f PVar12;
  Point3f PVar13;
  Vector3<float> VVar14;
  Float sc;
  allocator<char> local_209;
  float local_208;
  float local_204;
  SpectrumHandle L;
  Allocator alloc_local;
  Vector3<float> local_1d8;
  Transform t;
  string local_138;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_118;
  ulong local_110;
  Tuple3<pbrt::Vector3,_float> local_108;
  Tuple3<pbrt::Vector3,_float> local_f8;
  float local_e8;
  float local_e4;
  Float local_e0;
  Float local_dc;
  float local_d8;
  float local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  undefined1 local_bc [16];
  undefined4 local_ac;
  Transform finalRenderFromLight;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t,"L",(allocator<char> *)&finalRenderFromLight);
  local_110 = (ulong)&colorSpace->illuminant | 0x2000000000000;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&L,(string *)parameters,(SpectrumHandle *)&t,
             (SpectrumType)&local_110,(Allocator)0x1);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t,"scale",(allocator<char> *)&finalRenderFromLight);
  FVar5 = ParameterDictionary::GetOneFloat(parameters,(string *)&t,1.0);
  std::__cxx11::string::~string((string *)&t);
  uVar9 = 0;
  sc = FVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t,"from",(allocator<char> *)&local_e8);
  finalRenderFromLight.m.m[0][0] = 0.0;
  finalRenderFromLight.m.m[0][1] = 0.0;
  finalRenderFromLight.m.m[0][2] = 0.0;
  PVar12 = ParameterDictionary::GetOnePoint3f
                     (parameters,(string *)&t,(Point3f *)&finalRenderFromLight);
  local_204 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  std::__cxx11::string::~string((string *)&t);
  uVar10 = extraout_XMM0_Qb;
  std::__cxx11::string::string<std::allocator<char>>((string *)&t,"to",(allocator<char> *)&local_e8)
  ;
  finalRenderFromLight.m.m[0][0] = 0.0;
  finalRenderFromLight.m.m[0][1] = 0.0;
  finalRenderFromLight.m.m[0][2] = 1.0;
  PVar13 = ParameterDictionary::GetOnePoint3f
                     (parameters,(string *)&t,(Point3f *)&finalRenderFromLight);
  local_208 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  std::__cxx11::string::~string((string *)&t);
  auVar4._8_8_ = uVar9;
  auVar4._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_8_ = uVar10;
  auVar2._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4 = vsubps_avx(auVar4,auVar2);
  auVar11 = ZEXT856(auVar4._8_8_);
  t.m.m[0][2] = local_204 - local_208;
  t.m.m[0]._0_8_ = vmovlps_avx(auVar4);
  VVar14 = Normalize<float>((Vector3<float> *)&t);
  local_1d8.super_Tuple3<pbrt::Vector3,_float>.z = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar11;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  local_108.x = 0.0;
  local_108.y = 0.0;
  local_f8.z = 0.0;
  local_108.z = 0.0;
  local_1d8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar8._0_16_);
  CoordinateSystem<float>(&local_1d8,(Vector3<float> *)&local_f8,(Vector3<float> *)&local_108);
  local_e8 = local_f8.x;
  local_e4 = local_108.x;
  local_e0 = local_1d8.super_Tuple3<pbrt::Vector3,_float>.x;
  local_dc = 0.0;
  local_d8 = local_f8.y;
  local_d4 = local_108.y;
  local_d0 = local_1d8.super_Tuple3<pbrt::Vector3,_float>.y;
  local_cc = 0;
  local_c8 = local_f8.z;
  local_c4 = local_108.z;
  local_c0 = local_1d8.super_Tuple3<pbrt::Vector3,_float>.z;
  local_bc._0_12_ = ZEXT812(0);
  local_bc._12_4_ = 0;
  local_ac = 0x3f800000;
  Transform::Transform(&t,(Float (*) [4])&local_e8);
  Transform::operator*(&finalRenderFromLight,renderFromLight,&t);
  local_118 = L.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              .bits;
  FVar6 = SpectrumToPhotometric((SpectrumHandle *)&local_118);
  sc = FVar5 / FVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"illuminance",&local_209);
  FVar7 = ParameterDictionary::GetOneFloat(parameters,&local_138,-1.0);
  std::__cxx11::string::~string((string *)&local_138);
  if (0.0 < FVar7) {
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar4 = vxorps_avx512vl(ZEXT416((uint)local_1d8.super_Tuple3<pbrt::Vector3,_float>.y),auVar1);
    sc = (FVar7 / auVar4._0_4_) * (FVar5 / FVar6);
  }
  pDVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DistantLight,pbrt::Transform&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&finalRenderFromLight,&L,&sc,&alloc_local);
  return pDVar3;
}

Assistant:

DistantLight *DistantLight::Create(const Transform &renderFromLight,
                                   const ParameterDictionary &parameters,
                                   const RGBColorSpace *colorSpace, const FileLoc *loc,
                                   Allocator alloc) {
    SpectrumHandle L = parameters.GetOneSpectrum("L", &colorSpace->illuminant,
                                                 SpectrumType::General, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Point3f from = parameters.GetOnePoint3f("from", Point3f(0, 0, 0));
    Point3f to = parameters.GetOnePoint3f("to", Point3f(0, 0, 1));

    Vector3f w = Normalize(from - to);
    Vector3f v1, v2;
    CoordinateSystem(w, &v1, &v2);
    Float m[4][4] = {v1.x, v2.x, w.x, 0, v1.y, v2.y, w.y, 0,
                     v1.z, v2.z, w.z, 0, 0,    0,    0,   1};
    Transform t(m);
    Transform finalRenderFromLight = renderFromLight * t;

    // Scale the light spectrum to be equivalent to 1 nit
    sc /= SpectrumToPhotometric(L);

    // Adjust scale to meet target illuminance value
    // Like for IBLs we measure illuminance as incident on an upward-facing
    // patch.
    Float E_v = parameters.GetOneFloat("illuminance", -1);
    if (E_v > 0) {
        Float k_e = -w.y;
        sc *= E_v / k_e;
    }

    return alloc.new_object<DistantLight>(finalRenderFromLight, L, sc, alloc);
}